

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  int iVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  uint extraout_EAX;
  secp256k1_modinv32_signed30 *psVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  int extraout_EDX;
  int extraout_EDX_00;
  int32_t *piVar49;
  secp256k1_modinv32_signed30 *b;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  secp256k1_modinv32_signed30 *psVar56;
  secp256k1_fe *psVar57;
  long lVar58;
  ulong uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  secp256k1_fe *psVar63;
  ulong uVar64;
  secp256k1_fe *psVar65;
  secp256k1_fe *a;
  secp256k1_modinv32_signed30 *a_00;
  long lVar66;
  ulong uVar67;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  long lVar80;
  uint uVar81;
  secp256k1_modinv32_modinfo *psVar82;
  code *pcVar83;
  uint uVar84;
  secp256k1_modinv32_modinfo *psVar85;
  uint uVar86;
  code *pcVar87;
  code *pcVar88;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar89 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  uchar auStack_298 [40];
  secp256k1_fe *psStack_270;
  code *pcStack_268;
  ulong uStack_260;
  secp256k1_fe *psStack_258;
  code *pcStack_250;
  secp256k1_fe *psStack_248;
  code *pcStack_238;
  undefined1 auStack_230 [32];
  secp256k1_fe sStack_210;
  undefined1 auStack_1e0 [16];
  undefined1 auStack_1c8 [48];
  undefined8 uStack_198;
  secp256k1_fe *psStack_190;
  undefined8 uStack_188;
  code *pcStack_180;
  secp256k1_fe sStack_178;
  secp256k1_fe sStack_148;
  secp256k1_fe sStack_118;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_modinv32_signed30 *psStack_c8;
  ulong uStack_c0;
  code *pcStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  secp256k1_modinv32_signed30 *psStack_98;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  int32_t iStack_7c;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_modinfo *psStack_70;
  secp256k1_modinv32_modinfo *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  secp256k1_modinv32_signed30 *psStack_58;
  code *pcStack_50;
  long local_40;
  long local_38;
  
  uVar61 = t->u;
  psVar85 = (secp256k1_modinv32_modinfo *)(long)(int)uVar61;
  uVar48 = t->v;
  lVar58 = (long)(int)uVar48;
  uVar62 = t->q;
  psVar56 = (secp256k1_modinv32_signed30 *)(long)(int)uVar62;
  local_40 = (long)t->r;
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_50 = (code *)0x15715a;
  a_00 = d;
  iVar37 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
  if (iVar37 < 1) {
    pcStack_50 = (code *)0x1573c2;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_001573c2:
    pcStack_50 = (code *)0x1573c7;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_001573c7:
    pcStack_50 = (code *)0x1573cc;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_001573cc:
    pcStack_50 = (code *)0x1573d1;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_001573d1:
    pcStack_50 = (code *)0x1573d6;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001573d6:
    pcStack_50 = (code *)0x1573db;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001573db:
    pcStack_50 = (code *)0x1573e0;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001573e0:
    pcStack_50 = (code *)0x1573e5;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar82 = modinfo;
LAB_001573e5:
    pcStack_50 = (code *)0x1573ea;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001573ea:
    pcStack_50 = (code *)0x1573ef;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001573ef:
    pcStack_50 = (code *)0x1573f4;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x157177;
    a_00 = d;
    iVar37 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar37) goto LAB_001573c2;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x157194;
    a_00 = e;
    iVar37 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar37 < 1) goto LAB_001573c7;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x1571b1;
    a_00 = e;
    iVar37 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (-1 < iVar37) goto LAB_001573cc;
    psVar82 = (secp256k1_modinv32_modinfo *)-(long)psVar85;
    if (0 < (long)psVar85) {
      psVar82 = psVar85;
    }
    lVar42 = -lVar58;
    if (lVar58 < 1) {
      lVar42 = lVar58;
    }
    if (lVar42 + 0x40000000 < (long)psVar82) goto LAB_001573d1;
    psVar41 = (secp256k1_modinv32_signed30 *)-(long)psVar56;
    if (0 < (long)psVar56) {
      psVar41 = psVar56;
    }
    lVar42 = -local_40;
    if (local_40 < 1) {
      lVar42 = local_40;
    }
    if (lVar42 + 0x40000000 < (long)psVar41) goto LAB_001573d6;
    uVar68 = d->v[8] >> 0x1f;
    uVar60 = e->v[8] >> 0x1f;
    psVar63 = (secp256k1_fe *)(ulong)uVar60;
    iVar37 = (uVar60 & uVar48) + (uVar68 & uVar61);
    a_00 = (secp256k1_modinv32_signed30 *)(e->v[0] * lVar58 + (long)d->v[0] * (long)psVar85);
    lVar42 = (long)(modinfo->modulus).v[0];
    lVar46 = (long)(int)(iVar37 - ((int)a_00 * modinfo->modulus_inv30 + iVar37 & 0x3fffffff));
    piVar49 = (int32_t *)((long)a_00->v + lVar46 * lVar42);
    if (((ulong)piVar49 & 0x3fffffff) != 0) goto LAB_001573db;
    iVar37 = (uVar60 & (uint)local_40) + (uVar68 & uVar62);
    lVar80 = e->v[0] * local_40 + (long)d->v[0] * (long)psVar56;
    a_00 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar61 = iVar37 - (modinfo->modulus_inv30 * (int)lVar80 + iVar37 & 0x3fffffff);
    psVar63 = (secp256k1_fe *)(ulong)uVar61;
    uVar43 = lVar42 * (int)uVar61 + lVar80;
    local_38 = lVar46;
    if ((uVar43 & 0x3fffffff) != 0) goto LAB_001573e0;
    lVar42 = (long)uVar43 >> 0x1e;
    lVar80 = (long)piVar49 >> 0x1e;
    lVar66 = 1;
    do {
      lVar44 = (long)(modinfo->modulus).v[lVar66];
      lVar80 = lVar44 * lVar46 + e->v[lVar66] * lVar58 + (long)d->v[lVar66] * (long)psVar85 + lVar80
      ;
      psVar82 = (secp256k1_modinv32_modinfo *)(e->v[lVar66] * local_40);
      lVar42 = (long)(psVar82->modulus).v +
               (long)d->v[lVar66] * (long)psVar56 + lVar42 + lVar44 * (int)uVar61;
      d->v[lVar66 + -1] = (uint)lVar80 & 0x3fffffff;
      e->v[lVar66 + -1] = (uint)lVar42 & 0x3fffffff;
      lVar66 = lVar66 + 1;
      lVar42 = lVar42 >> 0x1e;
      lVar80 = lVar80 >> 0x1e;
    } while (lVar66 != 9);
    d->v[8] = (int32_t)lVar80;
    e->v[8] = (int32_t)lVar42;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x15735b;
    a_00 = d;
    iVar37 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
    psVar56 = e;
    psVar85 = modinfo;
    if (iVar37 < 1) goto LAB_001573e5;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x157378;
    a_00 = d;
    iVar37 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar37) goto LAB_001573ea;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x157391;
    a_00 = e;
    iVar37 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar37 < 1) goto LAB_001573ef;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x1573aa;
    a_00 = e;
    iVar37 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_50 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar61 = a_00->v[0];
  uVar64 = (ulong)uVar61;
  uVar48 = a_00->v[3];
  uVar50 = (ulong)uVar48;
  uVar62 = a_00->v[4];
  uVar45 = (ulong)uVar62;
  uVar60 = a_00->v[5];
  uVar59 = (ulong)uVar60;
  psVar41 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_00->v[6];
  uVar68 = a_00->v[7];
  uVar43 = (ulong)uVar68;
  iStack_7c = a_00->v[8];
  lVar42 = 0;
  do {
    psStack_78 = psVar56;
    psStack_70 = psVar82;
    psStack_68 = psVar85;
    psStack_60 = e;
    psStack_58 = d;
    pcStack_50 = (code *)lVar58;
    if (a_00->v[lVar42] < -0x3fffffff) {
      pcStack_b8 = (code *)0x157742;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00157742:
      pcStack_b8 = (code *)0x157747;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00157747;
    }
    if (0x3fffffff < a_00->v[lVar42]) goto LAB_00157742;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 9);
  uStack_9c = (uint)psVar63;
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_b8 = (code *)0x15747f;
  psVar41 = a_00;
  uStack_a8 = a_00->v[1];
  uStack_a4 = a_00->v[2];
  uStack_a0 = a_00->v[6];
  psStack_98 = b;
  iVar37 = secp256k1_modinv32_mul_cmp_30(a_00,9,b,-2);
  if (iVar37 < 1) {
LAB_00157747:
    pcStack_b8 = (code *)0x15774c;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015774c:
    pcStack_b8 = (code *)0x157751;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_00157751:
    pcStack_b8 = (code *)0x157756;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00157756:
    pcStack_b8 = (code *)0x15775b;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x15749e;
    psVar41 = a_00;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (-1 < iVar37) goto LAB_0015774c;
    uVar38 = iStack_7c >> 0x1f;
    uStack_80 = psStack_98->v[1];
    uVar39 = (uVar38 & uStack_80) + uStack_a8;
    uStack_a8 = psStack_98->v[2];
    uVar47 = (uVar38 & uStack_a8) + uStack_a4;
    uStack_a4 = psStack_98->v[3];
    uStack_84 = psStack_98->v[4];
    uStack_88 = psStack_98->v[5];
    uStack_8c = psStack_98->v[6];
    uVar84 = (uVar38 & uStack_8c) + uStack_a0;
    uStack_a0 = psStack_98->v[7];
    uStack_ac = (int)uStack_9c >> 0x1f;
    uStack_9c = psStack_98->v[8];
    uVar72 = ((uVar38 & psStack_98->v[0]) + uVar61 ^ uStack_ac) - uStack_ac;
    uVar69 = ((int)uVar72 >> 0x1e) + ((uVar39 ^ uStack_ac) - uStack_ac);
    uVar39 = ((int)uVar69 >> 0x1e) + ((uVar47 ^ uStack_ac) - uStack_ac);
    uVar86 = ((int)uVar39 >> 0x1e) + (((uVar38 & uStack_a4) + uVar48 ^ uStack_ac) - uStack_ac);
    uVar48 = ((int)uVar86 >> 0x1e) + (((uVar38 & uStack_84) + uVar62 ^ uStack_ac) - uStack_ac);
    uVar61 = ((int)uVar48 >> 0x1e) + (((uVar38 & uStack_88) + uVar60 ^ uStack_ac) - uStack_ac);
    uVar62 = ((int)uVar61 >> 0x1e) + ((uVar84 ^ uStack_ac) - uStack_ac);
    uVar60 = ((int)uVar62 >> 0x1e) + (((uVar38 & uStack_a0) + uVar68 ^ uStack_ac) - uStack_ac);
    uVar81 = ((int)uVar60 >> 0x1e) + (((uVar38 & uStack_9c) + iStack_7c ^ uStack_ac) - uStack_ac);
    uVar59 = (ulong)uVar81;
    uStack_b0 = (int)uVar81 >> 0x1f;
    uVar84 = (psStack_98->v[0] & uStack_b0) + (uVar72 & 0x3fffffff);
    uVar47 = (uStack_88 & uStack_b0) + (uVar61 & 0x3fffffff);
    uVar64 = (ulong)uVar47;
    uVar72 = (uStack_8c & uStack_b0) + (uVar62 & 0x3fffffff);
    uVar50 = (ulong)uVar72;
    uVar61 = ((int)uVar84 >> 0x1e) + (uStack_80 & uStack_b0) + (uVar69 & 0x3fffffff);
    uVar62 = ((int)uVar61 >> 0x1e) + (uStack_a8 & uStack_b0) + (uVar39 & 0x3fffffff);
    uVar68 = ((int)uVar62 >> 0x1e) + (uStack_a4 & uStack_b0) + (uVar86 & 0x3fffffff);
    uVar38 = ((int)uVar68 >> 0x1e) + (uStack_84 & uStack_b0) + (uVar48 & 0x3fffffff);
    uVar47 = ((int)uVar38 >> 0x1e) + uVar47;
    uVar72 = ((int)uVar47 >> 0x1e) + uVar72;
    uVar48 = ((int)uVar72 >> 0x1e) + (uStack_a0 & uStack_b0) + (uVar60 & 0x3fffffff);
    uVar60 = ((int)uVar48 >> 0x1e) + (uStack_9c & uStack_b0) + uVar81;
    uVar45 = (ulong)uVar60;
    uVar68 = uVar68 & 0x3fffffff;
    psVar63 = (secp256k1_fe *)(ulong)uVar68;
    uVar38 = uVar38 & 0x3fffffff;
    psVar41 = (secp256k1_modinv32_signed30 *)(ulong)uVar38;
    uVar48 = uVar48 & 0x3fffffff;
    uVar43 = (ulong)uVar48;
    a_00->v[0] = uVar84 & 0x3fffffff;
    a_00->v[1] = uVar61 & 0x3fffffff;
    a_00->v[2] = uVar62 & 0x3fffffff;
    a_00->v[3] = uVar68;
    a_00->v[4] = uVar38;
    a_00->v[5] = uVar47 & 0x3fffffff;
    a_00->v[6] = uVar72 & 0x3fffffff;
    a_00->v[7] = uVar48;
    a_00->v[8] = uVar60;
    if (0x3fffffff < uVar60) goto LAB_00157751;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x15770f;
    psVar41 = a_00;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,0);
    if (iVar37 < 0) goto LAB_00157756;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x15772a;
    psVar41 = a_00;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_b8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  a = &sStack_178;
  psVar57 = &sStack_178;
  pcVar83 = secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    pcVar83 = secp256k1_fe_inv;
  }
  pcStack_180 = (code *)0x157791;
  uStack_e0 = uVar43;
  uStack_d8 = uVar59;
  uStack_d0 = uVar50;
  psStack_c8 = a_00;
  uStack_c0 = uVar64;
  pcStack_b8 = (code *)uVar45;
  (*pcVar83)(&sStack_178);
  if (psVar41 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar41->v + 8) = sStack_178.n[4];
    *(ulong *)(psVar41[1].v + 1) = CONCAT44(sStack_178.normalized,sStack_178.magnitude);
    *(uint64_t *)(psVar41->v + 4) = sStack_178.n[2];
    *(uint64_t *)(psVar41->v + 6) = sStack_178.n[3];
    *(uint64_t *)psVar41->v = sStack_178.n[0];
    *(uint64_t *)(psVar41->v + 2) = sStack_178.n[1];
  }
  uVar59 = 0xffffffffffff;
  sStack_118.n[0] = psVar63->n[0];
  sStack_118.n[1] = psVar63->n[1];
  sStack_118.n[2] = psVar63->n[2];
  sStack_118.n[3] = psVar63->n[3];
  sStack_118.n[4] = psVar63->n[4];
  sStack_118.magnitude = psVar63->magnitude;
  sStack_118.normalized = psVar63->normalized;
  psVar65 = &sStack_118;
  pcStack_180 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar65);
  uVar43 = 0x1000003d1;
  uVar45 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
  if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
    uVar50 = (uVar45 >> 0x34) + sStack_118.n[1];
    uVar64 = (uVar50 >> 0x34) + sStack_118.n[2];
    uVar67 = (uVar64 >> 0x34) + sStack_118.n[3];
    uVar70 = (uVar67 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
    if ((((uVar50 | uVar45 | uVar64 | uVar67) & 0xfffffffffffff) != 0 || uVar70 != 0) &&
       (((uVar45 | 0x1000003d0) & uVar50 & uVar64 & uVar67 & (uVar70 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_180 = (code *)0x157c76;
    secp256k1_fe_verify(&sStack_178);
    uVar59 = sStack_178.n[4] & 0xffffffffffff;
    uVar45 = (sStack_178.n[4] >> 0x30) * 0x1000003d1 + sStack_178.n[0];
    uVar50 = (uVar45 >> 0x34) + sStack_178.n[1];
    uVar64 = (uVar50 >> 0x34) + sStack_178.n[2];
    a = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_178.n[3]);
    uVar67 = ((ulong)a >> 0x34) + uVar59;
    if ((((uVar50 | uVar45 | uVar64 | (ulong)a) & 0xfffffffffffff) == 0 && uVar67 == 0) ||
       (r = (secp256k1_fe *)(uVar67 ^ 0xf000000000000), psVar57 = &sStack_178,
       ((uVar45 ^ 0x1000003d0) & uVar50 & uVar64 & (ulong)a & (ulong)r) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_180 = (code *)0x1578b4;
    psVar65 = psVar63;
    secp256k1_fe_mul(&sStack_118,psVar63,&sStack_178);
    pcStack_180 = (code *)0x1578bc;
    secp256k1_fe_verify(&sStack_118);
    r = &fe_minus_one;
    pcStack_180 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_118.magnitude < 0x20) {
      sStack_118.n[0] = sStack_118.n[0] + 0xffffefffffc2e;
      sStack_118.n[1] = sStack_118.n[1] + 0xfffffffffffff;
      sStack_118.n[2] = sStack_118.n[2] + 0xfffffffffffff;
      sStack_118.n[3] = sStack_118.n[3] + 0xfffffffffffff;
      sStack_118.n[4] = sStack_118.n[4] + 0xffffffffffff;
      sStack_118.normalized = 0;
      sStack_118.magnitude = sStack_118.magnitude + 1;
      pcStack_180 = (code *)0x15791a;
      secp256k1_fe_verify(&sStack_118);
      pcStack_180 = (code *)0x157922;
      secp256k1_fe_verify(&sStack_118);
      uVar45 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
      uVar50 = (uVar45 >> 0x34) + sStack_118.n[1];
      uVar64 = (uVar50 >> 0x34) + sStack_118.n[2];
      psVar65 = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_118.n[3]);
      uVar67 = ((ulong)psVar65 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
      if ((((uVar50 | uVar45 | uVar64 | (ulong)psVar65) & 0xfffffffffffff) != 0 || uVar67 != 0) &&
         (r = (secp256k1_fe *)(uVar67 ^ 0xf000000000000),
         ((uVar45 ^ 0x1000003d0) & uVar50 & uVar64 & (ulong)psVar65 & (ulong)r) != 0xfffffffffffff))
      goto LAB_00157d09;
      sStack_148.n[0] = psVar63->n[0];
      sStack_148.n[1] = psVar63->n[1];
      sStack_148.n[2] = psVar63->n[2];
      sStack_148.n[3] = psVar63->n[3];
      sStack_148.n[4] = psVar63->n[4];
      sStack_148.magnitude = psVar63->magnitude;
      sStack_148.normalized = psVar63->normalized;
      psVar63 = &sStack_148;
      pcStack_180 = (code *)0x1579c8;
      secp256k1_fe_verify(psVar63);
      r = &fe_minus_one;
      pcStack_180 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_148.magnitude) goto LAB_00157d0e;
      sStack_148.n[0] = sStack_148.n[0] + 0xffffefffffc2e;
      sStack_148.n[1] = sStack_148.n[1] + 0xfffffffffffff;
      sStack_148.n[2] = sStack_148.n[2] + 0xfffffffffffff;
      sStack_148.n[3] = sStack_148.n[3] + 0xfffffffffffff;
      sStack_148.n[4] = sStack_148.n[4] + 0xffffffffffff;
      sStack_148.normalized = 0;
      sStack_148.magnitude = sStack_148.magnitude + 1;
      pcStack_180 = (code *)0x157a1f;
      secp256k1_fe_verify(&sStack_148);
      pcStack_180 = (code *)0x157a27;
      secp256k1_fe_verify(&sStack_148);
      uVar45 = (sStack_148.n[4] >> 0x30) * 0x1000003d1 + sStack_148.n[0];
      if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
        uVar50 = (uVar45 >> 0x34) + sStack_148.n[1];
        uVar64 = (uVar50 >> 0x34) + sStack_148.n[2];
        uVar67 = (uVar64 >> 0x34) + sStack_148.n[3];
        uVar70 = (uVar67 >> 0x34) + (sStack_148.n[4] & 0xffffffffffff);
        if (((uVar50 | uVar45 | uVar64 | uVar67) & 0xfffffffffffff) == 0 && uVar70 == 0) {
          return;
        }
        if (((uVar45 | 0x1000003d0) & uVar50 & uVar64 & uVar67 & (uVar70 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar65 = &sStack_148;
      pcStack_180 = (code *)0x157ad6;
      (*pcVar83)();
      pcStack_180 = (code *)0x157ae1;
      secp256k1_fe_verify(&sStack_178);
      r = &fe_minus_one;
      pcStack_180 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      psVar63 = &sStack_178;
      if (0x1f < sStack_178.magnitude) goto LAB_00157d13;
      sStack_178.n[0] = sStack_178.n[0] + 0xffffefffffc2e;
      sStack_178.n[1] = sStack_178.n[1] + 0xfffffffffffff;
      sStack_178.n[2] = sStack_178.n[2] + 0xfffffffffffff;
      sStack_178.n[3] = sStack_178.n[3] + 0xfffffffffffff;
      sStack_178.n[4] = sStack_178.n[4] + 0xffffffffffff;
      sStack_178.magnitude = sStack_178.magnitude + 1;
      sStack_178.normalized = 0;
      pcStack_180 = (code *)0x157b36;
      secp256k1_fe_verify(&sStack_178);
      pcStack_180 = (code *)0x157b3f;
      (*pcVar83)(&sStack_178);
      pcStack_180 = (code *)0x157b47;
      secp256k1_fe_verify(&sStack_178);
      sStack_178.n[0] = sStack_178.n[0] + 1;
      sStack_178.magnitude = sStack_178.magnitude + 1;
      sStack_178.normalized = 0;
      pcStack_180 = (code *)0x157b59;
      secp256k1_fe_verify(&sStack_178);
      pcStack_180 = (code *)0x157b61;
      secp256k1_fe_verify(&sStack_178);
      psVar65 = &sStack_148;
      pcStack_180 = (code *)0x157b6e;
      r = psVar65;
      secp256k1_fe_verify(psVar65);
      if (sStack_148.magnitude + sStack_178.magnitude < 0x21) {
        sStack_178.n[0] = sStack_178.n[0] + sStack_148.n[0];
        sStack_178.n[1] = sStack_178.n[1] + sStack_148.n[1];
        sStack_178.n[2] = sStack_178.n[2] + sStack_148.n[2];
        sStack_178.n[3] = sStack_178.n[3] + sStack_148.n[3];
        sStack_178.n[4] = sStack_178.n[4] + sStack_148.n[4];
        sStack_178.normalized = 0;
        pcStack_180 = (code *)0x157bba;
        sStack_178.magnitude = sStack_148.magnitude + sStack_178.magnitude;
        secp256k1_fe_verify(&sStack_178);
        pcStack_180 = (code *)0x157bc2;
        secp256k1_fe_verify(&sStack_178);
        uVar45 = (sStack_178.n[4] >> 0x30) * 0x1000003d1 + sStack_178.n[0];
        if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
          uVar59 = (uVar45 >> 0x34) + sStack_178.n[1];
          uVar50 = (uVar59 >> 0x34) + sStack_178.n[2];
          uVar64 = (uVar50 >> 0x34) + sStack_178.n[3];
          uVar67 = (uVar64 >> 0x34) + (sStack_178.n[4] & 0xffffffffffff);
          if (((uVar59 | uVar45 | uVar50 | uVar64) & 0xfffffffffffff) == 0 && uVar67 == 0) {
            return;
          }
          if (((uVar45 | 0x1000003d0) & uVar59 & uVar50 & uVar64 & (uVar67 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_180 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_180 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_180 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_180 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a = psVar65;
      psVar57 = psVar63;
      psVar65 = &sStack_118;
      pcStack_180 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_180 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_180 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_188 = 0xfffffffffffff;
  uStack_198 = 0x1000003d1;
  pcVar87 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar87 = secp256k1_scalar_inverse;
  }
  psVar63 = (secp256k1_fe *)auStack_230;
  psStack_248 = (secp256k1_fe *)0x157d58;
  r_00 = psVar63;
  auStack_1c8._32_8_ = psVar57;
  auStack_1c8._40_8_ = pcVar83;
  psStack_190 = psVar65;
  pcStack_180 = (code *)uVar59;
  uVar40 = (*pcVar87)();
  if (r != (secp256k1_fe *)0x0) {
    r->n[2] = CONCAT44(auStack_230._20_4_,auStack_230._16_4_);
    r->n[3] = CONCAT44(auStack_230._28_4_,auStack_230._24_4_);
    r->n[0] = CONCAT44(auStack_230._4_4_,auStack_230._0_4_);
    r->n[1] = CONCAT44(auStack_230._12_4_,auStack_230._8_4_);
  }
  uVar48 = 0;
  uVar62 = 0;
  uVar60 = 0;
  uVar68 = 0;
  auVar90._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar90._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar90._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar90._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar61 = movmskps(uVar40,auVar90);
  uVar61 = uVar61 ^ 0xf;
  if (uVar61 != 0) {
    uVar45 = a->n[0];
    uVar59 = a->n[1];
    uVar50 = a->n[2];
    uVar55 = CONCAT44(auStack_230._4_4_,auStack_230._0_4_);
    pcVar83 = (code *)CONCAT44(auStack_230._12_4_,auStack_230._8_4_);
    uVar43 = CONCAT44(auStack_230._20_4_,auStack_230._16_4_);
    r = (secp256k1_fe *)CONCAT44(auStack_230._28_4_,auStack_230._24_4_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar45;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar55;
    uVar51 = SUB168(auVar2 * auVar18,8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar51;
    sStack_210.n[0] = SUB168(auVar2 * auVar18,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar45;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar83;
    auVar3 = auVar3 * auVar19;
    uVar71 = SUB168(auVar3 + auVar36,0);
    uVar73 = SUB168(auVar3 + auVar36,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar59;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar55;
    uVar52 = SUB168(auVar4 * auVar20,8);
    uVar70 = SUB168(auVar4 * auVar20,0);
    uVar64 = (ulong)CARRY8(uVar71,uVar70);
    uVar67 = uVar73 + uVar52;
    uVar74 = uVar67 + uVar64;
    uVar76 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar51,auVar3._0_8_)) +
             (ulong)(CARRY8(uVar73,uVar52) || CARRY8(uVar67,uVar64));
    sStack_210.n[1] = uVar71 + uVar70;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar45;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar43;
    uVar53 = SUB168(auVar5 * auVar21,8);
    uVar64 = SUB168(auVar5 * auVar21,0);
    uVar70 = uVar74 + uVar64;
    uVar64 = (ulong)CARRY8(uVar74,uVar64);
    uVar51 = uVar76 + uVar53;
    uVar77 = uVar51 + uVar64;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar59;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = pcVar83;
    uVar74 = SUB168(auVar6 * auVar22,8);
    uVar67 = SUB168(auVar6 * auVar22,0);
    uVar75 = uVar70 + uVar67;
    uVar67 = (ulong)CARRY8(uVar70,uVar67);
    uVar52 = uVar77 + uVar74;
    uVar78 = uVar52 + uVar67;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar50;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar55;
    uVar54 = SUB168(auVar7 * auVar23,8);
    uVar73 = SUB168(auVar7 * auVar23,0);
    uVar70 = (ulong)CARRY8(uVar75,uVar73);
    uVar71 = uVar78 + uVar54;
    uVar79 = uVar71 + uVar70;
    uVar76 = (ulong)(CARRY8(uVar76,uVar53) || CARRY8(uVar51,uVar64)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar52,uVar67)) +
             (ulong)(CARRY8(uVar78,uVar54) || CARRY8(uVar71,uVar70));
    sStack_210.n[2] = uVar75 + uVar73;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar45;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = r;
    uVar73 = SUB168(auVar8 * auVar24,8);
    uVar45 = SUB168(auVar8 * auVar24,0);
    uVar67 = uVar79 + uVar45;
    uVar45 = (ulong)CARRY8(uVar79,uVar45);
    uVar51 = uVar76 + uVar73;
    uVar75 = uVar51 + uVar45;
    pcVar88 = (code *)a->n[3];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar59;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar43;
    uVar53 = SUB168(auVar9 * auVar25,8);
    uVar64 = SUB168(auVar9 * auVar25,0);
    uVar70 = uVar67 + uVar64;
    uVar64 = (ulong)CARRY8(uVar67,uVar64);
    uVar52 = uVar75 + uVar53;
    uVar77 = uVar52 + uVar64;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar50;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pcVar83;
    uVar74 = SUB168(auVar10 * auVar26,8);
    uVar67 = SUB168(auVar10 * auVar26,0);
    uVar79 = uVar70 + uVar67;
    uVar67 = (ulong)CARRY8(uVar70,uVar67);
    uVar71 = uVar77 + uVar74;
    uVar78 = uVar71 + uVar67;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pcVar88;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar55;
    uVar54 = SUB168(auVar11 * auVar27,8);
    uVar70 = SUB168(auVar11 * auVar27,0);
    sStack_210.n[3] = uVar79 + uVar70;
    uVar70 = (ulong)CARRY8(uVar79,uVar70);
    uVar55 = uVar78 + uVar54;
    uVar79 = uVar55 + uVar70;
    uVar73 = (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar51,uVar45)) +
             (ulong)(CARRY8(uVar75,uVar53) || CARRY8(uVar52,uVar64)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar71,uVar67)) +
             (ulong)(CARRY8(uVar78,uVar54) || CARRY8(uVar55,uVar70));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar59;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = r;
    uVar52 = SUB168(auVar12 * auVar28,8);
    uVar45 = SUB168(auVar12 * auVar28,0);
    uVar64 = uVar79 + uVar45;
    uVar45 = (ulong)CARRY8(uVar79,uVar45);
    uVar67 = uVar73 + uVar52;
    uVar53 = uVar67 + uVar45;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar50;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar43;
    uVar71 = SUB168(auVar13 * auVar29,8);
    uVar59 = SUB168(auVar13 * auVar29,0);
    uVar51 = uVar64 + uVar59;
    uVar59 = (ulong)CARRY8(uVar64,uVar59);
    uVar70 = uVar53 + uVar71;
    uVar74 = uVar70 + uVar59;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = pcVar88;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = pcVar83;
    uVar55 = SUB168(auVar14 * auVar30,8);
    uVar64 = SUB168(auVar14 * auVar30,0);
    sStack_210.n[4] = uVar51 + uVar64;
    uVar64 = (ulong)CARRY8(uVar51,uVar64);
    uVar51 = uVar74 + uVar55;
    uVar54 = uVar51 + uVar64;
    uVar51 = (ulong)(CARRY8(uVar73,uVar52) || CARRY8(uVar67,uVar45)) +
             (ulong)(CARRY8(uVar53,uVar71) || CARRY8(uVar70,uVar59)) +
             (ulong)(CARRY8(uVar74,uVar55) || CARRY8(uVar51,uVar64));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar50;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = r;
    uVar67 = SUB168(auVar15 * auVar31,8);
    uVar45 = SUB168(auVar15 * auVar31,0);
    uVar64 = uVar54 + uVar45;
    uVar45 = (ulong)CARRY8(uVar54,uVar45);
    uVar50 = uVar51 + uVar67;
    uVar52 = uVar50 + uVar45;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar88;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar43;
    uVar70 = SUB168(auVar16 * auVar32,8);
    uVar59 = SUB168(auVar16 * auVar32,0);
    sStack_210._40_8_ = uVar64 + uVar59;
    uVar59 = (ulong)CARRY8(uVar64,uVar59);
    uVar64 = uVar52 + uVar70;
    auStack_1e0._8_8_ =
         (ulong)(CARRY8(uVar51,uVar67) || CARRY8(uVar50,uVar45)) +
         (ulong)(CARRY8(uVar52,uVar70) || CARRY8(uVar64,uVar59));
    auStack_1e0._0_8_ = uVar64 + uVar59;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar88;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r;
    auStack_1e0 = auVar17 * auVar33 + auStack_1e0;
    psVar63 = (secp256k1_fe *)auStack_1c8;
    psStack_248 = (secp256k1_fe *)0x157ef3;
    r_00 = psVar63;
    pcStack_238 = pcVar87;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar63,(uint64_t *)(auStack_230 + 0x20));
    if (((auStack_1c8._0_8_ != 1 || auStack_1c8._8_8_ != 0) || auStack_1c8._16_8_ != 0) ||
        auStack_1c8._24_8_ != 0) {
      psStack_248 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_248 = (secp256k1_fe *)0x157f23;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_230 + 0x20),(secp256k1_scalar *)a,
                        &scalar_minus_one);
    pcVar87 = pcStack_238;
    auVar89._0_4_ = -(uint)((int)sStack_210.n[2] == 0 && (int)sStack_210.n[0] == 0);
    auVar89._4_4_ = -(uint)(sStack_210.n[2]._4_4_ == 0 && sStack_210.n[0]._4_4_ == 0);
    auVar89._8_4_ = -(uint)((int)sStack_210.n[3] == 0 && (int)sStack_210.n[1] == 0);
    auVar89._12_4_ = -(uint)(sStack_210.n[3]._4_4_ == 0 && sStack_210.n[1]._4_4_ == 0);
    iVar37 = movmskps(iVar37,auVar89);
    if (iVar37 == 0xf) {
      return;
    }
    psVar63 = (secp256k1_fe *)(auStack_230 + 0x20);
    psStack_248 = (secp256k1_fe *)0x157f53;
    (*pcStack_238)(psVar63,psVar63);
    r = (secp256k1_fe *)auStack_230;
    psStack_248 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r,&scalar_minus_one,(secp256k1_scalar *)r);
    psStack_248 = (secp256k1_fe *)0x157f73;
    (*pcVar87)(r,r);
    psStack_248 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r,(secp256k1_scalar *)r,&secp256k1_scalar_one);
    psStack_248 = (secp256k1_fe *)0x157f93;
    r_00 = r;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r,(secp256k1_scalar *)psVar63,(secp256k1_scalar *)r);
    auVar91._0_4_ = -(uint)(auStack_230._16_4_ == 0 && auStack_230._0_4_ == 0);
    auVar91._4_4_ = -(uint)(auStack_230._20_4_ == 0 && auStack_230._4_4_ == 0);
    auVar91._8_4_ = -(uint)(auStack_230._24_4_ == 0 && auStack_230._8_4_ == 0);
    auVar91._12_4_ = -(uint)(auStack_230._28_4_ == 0 && auStack_230._12_4_ == 0);
    iVar37 = movmskps(iVar37,auVar91);
    if (iVar37 == 0xf) {
      return;
    }
    psStack_248 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar61 = extraout_EAX;
    uVar48 = extraout_XMM0_Da;
    uVar62 = extraout_XMM0_Db;
    uVar60 = extraout_XMM0_Dc;
    uVar68 = extraout_XMM0_Dd;
  }
  auVar92._0_4_ = -(uint)((auStack_230._16_4_ | auStack_230._0_4_) == uVar48);
  auVar92._4_4_ = -(uint)((auStack_230._20_4_ | auStack_230._4_4_) == uVar62);
  auVar92._8_4_ = -(uint)((auStack_230._24_4_ | auStack_230._8_4_) == uVar60);
  auVar92._12_4_ = -(uint)((auStack_230._28_4_ | auStack_230._12_4_) == uVar68);
  iVar37 = movmskps(uVar61,auVar92);
  pcVar88 = pcVar87;
  if (iVar37 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_248 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_270 = psVar63;
  pcStack_268 = pcVar83;
  uStack_260 = uVar43;
  psStack_258 = r;
  pcStack_250 = pcVar88;
  psStack_248 = a;
  do {
    secp256k1_testrand256(auStack_298);
    secp256k1_fe_impl_set_b32_mod(r_00,auStack_298);
    bVar34 = (r_00->n[2] & r_00->n[3] & r_00->n[1]) == 0xfffffffffffff;
    bVar35 = r_00->n[4] == 0xffffffffffff;
    bVar1 = 0xffffefffffc2e < r_00->n[0];
    if (bVar1 && (bVar34 && bVar35)) {
      r_00->magnitude = -1;
    }
    else {
      r_00->magnitude = 1;
      r_00->normalized = 1;
      secp256k1_fe_verify(r_00);
    }
  } while (bVar1 && (bVar34 && bVar35));
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */
#endif
    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
#endif
}